

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O2

int __thiscall CNode::GetRefCount(CNode *this)

{
  long in_FS_OFFSET;
  
  if ((this->nRefCount).super___atomic_base<int>._M_i < 0) {
    __assert_fail("nRefCount >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.h",
                  0x385,"int CNode::GetRefCount() const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (this->nRefCount).super___atomic_base<int>._M_i;
  }
  __stack_chk_fail();
}

Assistant:

int GetRefCount() const
    {
        assert(nRefCount >= 0);
        return nRefCount;
    }